

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O0

void __thiscall
soul::ArrayWithPreallocation<unsigned_long,_16UL>::reserve
          (ArrayWithPreallocation<unsigned_long,_16UL> *this,size_t minSize)

{
  unsigned_long uVar1;
  void *pvVar2;
  ulong local_28;
  size_t i;
  unsigned_long *newObjects;
  size_t minSize_local;
  ArrayWithPreallocation<unsigned_long,_16UL> *this_local;
  
  if (*(ulong *)(this + 0x10) < minSize) {
    uVar1 = getAlignedSize<16,unsigned_long>(minSize);
    if (0x10 < uVar1) {
      pvVar2 = operator_new__(uVar1 << 3);
      for (local_28 = 0; local_28 < *(ulong *)(this + 8); local_28 = local_28 + 1) {
        *(undefined8 *)((long)pvVar2 + local_28 * 8) = *(undefined8 *)(*(long *)this + local_28 * 8)
        ;
      }
      freeIfHeapAllocated(this);
      *(void **)this = pvVar2;
    }
    *(unsigned_long *)(this + 0x10) = uVar1;
  }
  return;
}

Assistant:

void reserve (size_t minSize)
    {
        if (minSize > numAllocated)
        {
            minSize = getAlignedSize<16> (minSize);

            if (minSize > preallocatedItems)
            {
                auto* newObjects = reinterpret_cast<Item*> (new char[minSize * sizeof (Item)]);

                for (size_t i = 0; i < numActive; ++i)
                {
                    new (newObjects + i) Item (std::move (items[i]));
                    items[i].~Item();
                }

                freeIfHeapAllocated();
                items = newObjects;
            }

            numAllocated = minSize;
        }
    }